

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * Fantasy_Character_parse_json_union
                 (flatcc_json_parser_t *ctx,char *buf,char *end,uint8_t type,
                 flatcc_builder_ref_t *result)

{
  char *pcVar1;
  flatcc_builder_ref_t *result_local;
  uint8_t type_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  *result = 0;
  if (type == '\0') {
    ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_none(ctx,buf,end);
  }
  else {
    if (type == '\x02') {
      end_local = Fantasy_Attacker_parse_json_table(ctx,buf,end,result);
    }
    else if (type == '\b') {
      end_local = Fantasy_Rapunzel_parse_json_struct(ctx,buf,end,result);
    }
    else if (type == '\t') {
      end_local = Fantasy_BookReader_parse_json_struct(ctx,buf,end,result);
    }
    else if (type == '\n') {
      end_local = Fantasy_BookReader_parse_json_struct(ctx,buf,end,result);
    }
    else if (type == '\v') {
      end_local = flatcc_json_parser_build_string(ctx,buf,end,result);
    }
    else {
      if (type != 0xff) {
        if ((ctx->flags & 1) == 0) {
          pcVar1 = flatcc_json_parser_set_error(ctx,buf,end,0xf);
          return pcVar1;
        }
        pcVar1 = flatcc_json_parser_generic_json(ctx,buf,end);
        return pcVar1;
      }
      end_local = flatcc_json_parser_build_string(ctx,buf,end,result);
    }
    if (ctx->error == 0) {
      if (*result == 0) {
        ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,end_local,end,0x23);
      }
      else {
        ctx_local = (flatcc_json_parser_t *)end_local;
      }
    }
    else {
      ctx_local = (flatcc_json_parser_t *)end_local;
    }
  }
  return (char *)ctx_local;
}

Assistant:

static const char *Fantasy_Character_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *result)
{

    *result = 0;
    switch (type) {
    case 0: /* NONE */
        return flatcc_json_parser_none(ctx, buf, end);
    case 2: /* MuLan */
        buf = Fantasy_Attacker_parse_json_table(ctx, buf, end, result);
        break;
    case 8: /* Rapunzel */
        buf = Fantasy_Rapunzel_parse_json_struct(ctx, buf, end, result);
        break;
    case 9: /* Belle */
        buf = Fantasy_BookReader_parse_json_struct(ctx, buf, end, result);
        break;
    case 10: /* BookFan */
        buf = Fantasy_BookReader_parse_json_struct(ctx, buf, end, result);
        break;
    case 11: /* Other */
        buf = flatcc_json_parser_build_string(ctx, buf, end, result);
        break;
    case 255: /* Unused */
        buf = flatcc_json_parser_build_string(ctx, buf, end, result);
        break;
    default:
        if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);
        } else {
            return flatcc_json_parser_generic_json(ctx, buf, end);
        }
    }
    if (ctx->error) return buf;
    if (!*result) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
    }
    return buf;
}